

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
::
ReadLinearExpr<mp::internal::NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>::ObjHandler>
          (NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>>>>>
           *this)

{
  int iVar1;
  
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
              *)this,*(uint *)(*(long *)(this + 8) + 8));
  iVar1 = NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
          ::ReadUInt((NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
                      *)this,1,**(int **)(this + 8) + 1);
  ReadLinearExpr<mp::NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>,mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)71>>::LinearExprHandler>
            (this,iVar1);
  return;
}

Assistant:

void NLReader<Reader, Handler>::ReadLinearExpr() {
  LinearHandler lh(*this);
  int index = ReadUInt(lh.num_items());
  // The number of terms should be less than num_vars because common
  // expressions are not allowed in a linear expression.
  int num_terms = ReadUInt(1, header_.num_vars + 1u);
  reader_.ReadTillEndOfLine();
  if (lh.SkipExpr(index))
    ReadLinearExpr(num_terms, NullLinearExprHandler());
  else
    ReadLinearExpr(num_terms, lh.OnLinearExpr(index, num_terms));
}